

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Hash_Blake2s_Simd128.c
# Opt level: O0

void reset_raw(Hacl_Hash_Blake2b_Simd256_state_t *state,
              K____Hacl_Impl_Blake2_Core_blake2_params___uint8_t_ key)

{
  Hacl_Hash_Blake2b_blake2_params p_00;
  uint uVar1;
  Lib_IntVector_Intrinsics_vec256 *in_stack_000000d8;
  uint8_t *in_stack_ffffffffffffff10;
  uint8_t *local_e8;
  Hacl_Hash_Blake2b_Simd256_state_t tmp;
  uint32_t ite;
  uint8_t kk11;
  Hacl_Hash_Blake2b_blake2_params pv;
  uint8_t *sub_b;
  uint8_t *k_1;
  uint32_t kk2;
  Hacl_Hash_Blake2b_index i1;
  uint8_t nn;
  uint8_t kk1;
  Hacl_Hash_Blake2b_blake2_params *p;
  char cStack_68;
  Hacl_Hash_Blake2b_index i;
  uint8_t kk10;
  uint8_t nn0;
  Hacl_Hash_Blake2b_Simd256_block_state_t block_state;
  uint8_t *buf;
  Hacl_Hash_Blake2b_Simd256_state_t scrut;
  Hacl_Hash_Blake2b_Simd256_state_t *state_local;
  K____Hacl_Impl_Blake2_Core_blake2_params___uint8_t_ key_local;
  
  scrut.total_len = (uint64_t)state;
  memcpy(&buf,state,0x28);
  cStack_68 = (char)buf;
  uVar1 = (uint)(key.fst)->key_length;
  if (uVar1 != 0) {
    pv.personal = (uint8_t *)((long)*scrut.block_state.thd.snd + (ulong)uVar1);
    memset(pv.personal,0,(ulong)(0x80 - uVar1));
    memcpy(scrut.block_state.thd.snd,key.snd,(ulong)uVar1);
  }
  memcpy(&ite,key.fst,0x28);
  p_00.node_offset = pv.node_offset;
  p_00.digest_length = pv.digest_length;
  p_00.key_length = pv.key_length;
  p_00.fanout = pv.fanout;
  p_00.depth = pv.depth;
  p_00.leaf_length = pv.leaf_length;
  p_00.node_depth = pv.node_depth;
  p_00.inner_length = pv.inner_length;
  p_00._18_6_ = pv._18_6_;
  p_00.salt = pv.salt;
  p_00.personal = in_stack_ffffffffffffff10;
  init_with_params(in_stack_000000d8,p_00);
  tmp.total_len._7_1_ = cStack_68;
  if (cStack_68 == '\0') {
    tmp.total_len._0_4_ = 0;
  }
  else {
    tmp.total_len._0_4_ = 0x80;
  }
  local_e8 = buf;
  tmp.block_state.fst = scrut.block_state.fst;
  tmp.block_state.snd = scrut.block_state.snd;
  tmp.block_state._2_6_ = scrut.block_state._2_6_;
  tmp.block_state.thd.fst = scrut.block_state.thd.fst;
  tmp.block_state.thd.snd = scrut.block_state.thd.snd;
  tmp.buf = (uint8_t *)(ulong)(uint)tmp.total_len;
  memcpy((void *)scrut.total_len,&local_e8,0x28);
  return;
}

Assistant:

static void
reset_raw(
  Hacl_Hash_Blake2s_Simd128_state_t *state,
  K____Hacl_Impl_Blake2_Core_blake2_params___uint8_t_ key
)
{
  Hacl_Hash_Blake2s_Simd128_state_t scrut = *state;
  uint8_t *buf = scrut.buf;
  Hacl_Hash_Blake2s_Simd128_block_state_t block_state = scrut.block_state;
  uint8_t nn0 = block_state.snd;
  uint8_t kk10 = block_state.fst;
  Hacl_Hash_Blake2b_index i = { .key_length = kk10, .digest_length = nn0 };
  KRML_MAYBE_UNUSED_VAR(i);
  Hacl_Hash_Blake2b_blake2_params *p = key.fst;
  uint8_t kk1 = p->key_length;
  uint8_t nn = p->digest_length;
  Hacl_Hash_Blake2b_index i1 = { .key_length = kk1, .digest_length = nn };
  uint32_t kk2 = (uint32_t)i1.key_length;
  uint8_t *k_1 = key.snd;
  if (!(kk2 == 0U))
  {
    uint8_t *sub_b = buf + kk2;
    memset(sub_b, 0U, (64U - kk2) * sizeof (uint8_t));
    memcpy(buf, k_1, kk2 * sizeof (uint8_t));
  }
  Hacl_Hash_Blake2b_blake2_params pv = p[0U];
  init_with_params(block_state.thd.snd, pv);
  uint8_t kk11 = i.key_length;
  uint32_t ite;
  if (kk11 != 0U)
  {
    ite = 64U;
  }
  else
  {
    ite = 0U;
  }
  Hacl_Hash_Blake2s_Simd128_state_t
  tmp = { .block_state = block_state, .buf = buf, .total_len = (uint64_t)ite };
  state[0U] = tmp;
}